

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void envy_bios_print(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_part *peVar2;
  envy_bios_mmioinit_entry *peVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  envy_bios_hwea_entry *peVar10;
  long lVar11;
  ulong uVar12;
  
  if ((mask & 1) != 0) {
    fprintf((FILE *)out,"BIOS size 0x%x [orig: 0x%x], %d valid parts:\n",(ulong)bios->length,
            (ulong)bios->origlength,(ulong)(uint)bios->partsnum);
    if (0 < bios->partsnum) {
      lVar9 = 0;
      uVar12 = 0;
      do {
        fputc(10,(FILE *)out);
        peVar2 = bios->parts;
        if ((peVar2->pcir_class[lVar9 + 5] == '\x03') || (peVar2->pcir_class[lVar9 + 5] == '\0')) {
          fprintf((FILE *)out,"BIOS part %d at 0x%x size 0x%x [init: 0x%x]. Sig:\n",
                  uVar12 & 0xffffffff,(ulong)*(uint *)(peVar2->pcir_class + lVar9 + -0x23),
                  (ulong)*(uint *)(peVar2->pcir_class + lVar9 + -0x1f),
                  (ulong)*(uint *)(peVar2->pcir_class + lVar9 + 0xd));
          if (*(int *)(bios->parts->pcir_class + lVar9 + 0x11) == 0) {
            fwrite("WARN: checksum fail\n",0x14,1,(FILE *)out);
          }
        }
        else {
          fprintf((FILE *)out,"BIOS part %d at 0x%x size 0x%x. Sig:\n",uVar12 & 0xffffffff,
                  (ulong)*(uint *)(peVar2->pcir_class + lVar9 + -0x23),
                  (ulong)*(uint *)(peVar2->pcir_class + lVar9 + -0x1f));
        }
        fwrite("PCI Expansion ROM Header:\n",0x1a,1,(FILE *)out);
        envy_bios_dump_hex(bios,out,*(uint *)(bios->parts->pcir_class + lVar9 + -0x23),0x1a,mask);
        peVar2 = bios->parts;
        if (*(uint *)(peVar2->pcir_class + lVar9 + -0x1b) != 0) {
          fprintf((FILE *)out,
                  "ROM Header EFI pointer: 0x%04x (subsystem: 0x%04x, machine: 0x%04x, compression: 0x%04x)\n"
                  ,(ulong)*(uint *)(peVar2->pcir_class + lVar9 + -0x1b),
                  (ulong)*(ushort *)(peVar2->pcir_class + lVar9 + -0x17),
                  (ulong)*(ushort *)(peVar2->pcir_class + lVar9 + -0x15),
                  (ulong)*(ushort *)(peVar2->pcir_class + lVar9 + -0x13));
        }
        fprintf((FILE *)out,"ROM Header PCIR pointer: 0x%04x\n",
                (ulong)*(uint *)(bios->parts->pcir_class + lVar9 + -0xf));
        pcVar5 = find_enum(pcir_rev_types,(uint)bios->parts->pcir_class[lVar9 + -1]);
        fprintf((FILE *)out,"PCIR [rev 0x%02x [%s]]:\n",(ulong)bios->parts->pcir_class[lVar9 + -1],
                pcVar5);
        peVar2 = bios->parts;
        envy_bios_dump_hex(bios,out,*(int *)(peVar2->pcir_class + lVar9 + -0xf) +
                                    *(int *)(peVar2->pcir_class + lVar9 + -0x23),
                           (uint)*(ushort *)(peVar2->pcir_class + lVar9 + -3),mask);
        peVar2 = bios->parts;
        fprintf((FILE *)out,"PCI device: 0x%04x:0x%04x, class 0x%02x%02x%02x\n",
                (ulong)*(ushort *)(peVar2->pcir_class + lVar9 + -0xb),
                (ulong)*(ushort *)(peVar2->pcir_class + lVar9 + -9),
                (ulong)peVar2->pcir_class[lVar9 + 2],(ulong)peVar2->pcir_class[lVar9 + 1],
                (uint)peVar2->pcir_class[lVar9]);
        if (*(short *)(bios->parts->pcir_class + lVar9 + -7) != 0) {
          fprintf((FILE *)out,"PCIR VPD: 0x%x\n");
        }
        if (*(short *)(bios->parts->pcir_class + lVar9 + -5) != 0) {
          fprintf((FILE *)out,"PCI device list pointer: 0x%04x\n");
        }
        pcVar5 = find_enum(pcir_code_types,(uint)bios->parts->pcir_class[lVar9 + 5]);
        fprintf((FILE *)out,"PCIR code type: 0x%02x [%s], rev 0x%04x\n",
                (ulong)bios->parts->pcir_class[lVar9 + 5],pcVar5,
                (ulong)*(ushort *)(bios->parts->pcir_class + lVar9 + 3));
        fprintf((FILE *)out,"PCIR indicator: 0x%02x\n",(ulong)bios->parts->pcir_class[lVar9 + 6]);
        if (*(short *)(bios->parts->pcir_class + lVar9 + 7) != 0) {
          fprintf((FILE *)out,"PCIR maximum run-time image length: 0x%04x\n");
        }
        if (*(short *)(bios->parts->pcir_class + lVar9 + 9) != 0) {
          fprintf((FILE *)out,"PCIR configuration utility code header pointer: 0x%04x\n");
        }
        if (*(short *)(bios->parts->pcir_class + lVar9 + 0xb) != 0) {
          fprintf((FILE *)out,"PCIR DMTF CLP entry point pointer: 0x%04x\n");
        }
        uVar12 = uVar12 + 1;
        lVar9 = lVar9 + 0x38;
      } while ((long)uVar12 < (long)bios->partsnum);
    }
    if (bios->broken_part != 0) {
      fprintf((FILE *)out,"\nWARN: Couldn\'t read part %d!\n");
    }
    fputc(10,(FILE *)out);
  }
  switch(bios->type) {
  case ENVY_BIOS_TYPE_UNKNOWN:
    if ((mask & 2) != 0) {
      fwrite("BIOS type: UNKNOWN!\n\n",0x15,1,(FILE *)out);
    }
    break;
  case ENVY_BIOS_TYPE_NV01:
    if ((mask & 2) != 0) {
      fwrite("BIOS type: NV01\n\n",0x11,1,(FILE *)out);
    }
    if (-1 < (char)mask) break;
    fwrite("Pre-mem scripts:\n\n",0x12,1,(FILE *)out);
    print_nv01_init_script(bios,out,0x17bc,mask);
    print_nv01_init_script(bios,out,0x17a2,mask);
    print_nv01_init_script(bios,out,0x18f4,mask);
    fwrite("1MB script:\n\n",0xd,1,(FILE *)out);
    print_nv01_init_script(bios,out,0x199a,mask);
    fwrite("2MB script:\n\n",0xd,1,(FILE *)out);
    print_nv01_init_script(bios,out,0x19db,mask);
    fwrite("4MB script:\n\n",0xd,1,(FILE *)out);
    print_nv01_init_script(bios,out,0x1a1c,mask);
    fwrite("Post-mem scripts:\n\n",0x13,1,(FILE *)out);
    print_nv01_init_script(bios,out,0x198d,mask);
    print_nv01_init_script(bios,out,0x1929,mask);
    fwrite("Unknown scripts:\n\n",0x12,1,(FILE *)out);
    uVar6 = 0x184f;
    goto LAB_002519c7;
  case ENVY_BIOS_TYPE_NV03:
    if ((mask & 2) != 0) {
      fwrite("BIOS type: NV03\n\n",0x11,1,(FILE *)out);
    }
    if ((mask & 4) != 0) {
      fprintf((FILE *)out,"Subsystem id: 0x%04x:0x%04x\n",(ulong)bios->subsystem_vendor,
              (ulong)bios->subsystem_device);
      envy_bios_dump_hex(bios,out,0x54,4,mask);
      fputc(10,(FILE *)out);
    }
    if (((mask & 8) != 0) && (bios->bmp_length != 0)) {
      fprintf((FILE *)out,"BMP 0x%02x.%02x at 0x%x\n",(ulong)bios->bmp_ver_major,
              (ulong)bios->bmp_ver_minor,(ulong)bios->bmp_offset);
      envy_bios_dump_hex(bios,out,bios->bmp_offset,bios->bmp_length,mask);
      fprintf((FILE *)out,"x86 mode pointer: 0x%x\n",(ulong)bios->mode_x86);
      fprintf((FILE *)out,"x86 init pointer: 0x%x\n",(ulong)bios->init_x86);
      fprintf((FILE *)out,"init script pointer: 0x%x\n",(ulong)bios->init_script);
      fputc(10,(FILE *)out);
    }
    uVar6 = (uint)bios->init_script;
    if (bios->init_script == 0) break;
LAB_002519c7:
    print_nv01_init_script(bios,out,uVar6,mask);
    break;
  case ENVY_BIOS_TYPE_NV04:
    if ((mask & 2) != 0) {
      fwrite("BIOS type: NV04\n\n",0x11,1,(FILE *)out);
    }
    if ((mask & 4) != 0) {
      fprintf((FILE *)out,"Subsystem id: 0x%04x:0x%04x\n",(ulong)bios->subsystem_vendor,
              (ulong)bios->subsystem_device);
      envy_bios_dump_hex(bios,out,0x54,4,mask);
      if (bios->hwinfo_ext_valid != '\0') {
        fprintf((FILE *)out,"Straps 0: select 0x%08x value 0x%08x\n",(ulong)bios->straps0_select,
                (ulong)bios->straps0_value);
        fprintf((FILE *)out,"Straps 1: select 0x%08x value 0x%08x\n",(ulong)bios->straps1_select,
                (ulong)bios->straps1_value);
        envy_bios_dump_hex(bios,out,0x58,0x14,mask);
        if (0 < bios->mmioinitsnum) {
          lVar9 = 0;
          do {
            fprintf((FILE *)out,"Addr 0x%08x len %d\n",(ulong)bios->mmioinits[lVar9].addr,
                    (ulong)bios->mmioinits[lVar9].len);
            peVar3 = bios->mmioinits;
            if (peVar3[lVar9].len != 0) {
              iVar4 = 0;
              uVar12 = 0;
              do {
                fprintf((FILE *)out,"\tR[0x%08x] <= 0x%08x\n",(ulong)(peVar3[lVar9].addr + iVar4),
                        (ulong)peVar3[lVar9].data[uVar12]);
                uVar12 = uVar12 + 1;
                peVar3 = bios->mmioinits;
                iVar4 = iVar4 + 4;
              } while (uVar12 < peVar3[lVar9].len);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < bios->mmioinitsnum);
        }
        envy_bios_dump_hex(bios,out,bios->mmioinit_offset,bios->mmioinit_len,mask);
      }
      fputc(10,(FILE *)out);
      if (bios->hwea_offset != 0) {
        fprintf((FILE *)out,"HWEA at 0x%04x:\n");
        if (0 < bios->hwea_entriesnum) {
          lVar9 = 0;
          do {
            peVar10 = bios->hwea_entries + lVar9;
            if (bios->hwea_version == 0) {
              if (peVar10->len != 0) {
                iVar4 = 0;
                uVar12 = 0;
                do {
                  fputc(9,(FILE *)out);
                  if (peVar10->type == '\x01') {
                    iVar7 = 0x44;
LAB_00251413:
                    fputc(iVar7,(FILE *)out);
                  }
                  else {
                    if (peVar10->type == '\0') {
                      iVar7 = 0x43;
                      goto LAB_00251413;
                    }
                    fprintf((FILE *)out,"UNK%02X");
                  }
                  fprintf((FILE *)out,"[0x%04x] <= 0x%08x\n",(ulong)(peVar10->base + iVar4),
                          (ulong)peVar10->data[uVar12]);
                  uVar12 = uVar12 + 1;
                  iVar4 = iVar4 + 4;
                } while (uVar12 < peVar10->len);
              }
            }
            else if (peVar10->type < 2) {
              if (peVar10->len != 0) {
                iVar4 = 0;
                uVar12 = 0;
                do {
                  iVar7 = iVar4;
                  if (peVar10->type != '\0') {
                    iVar7 = 0;
                  }
                  fprintf((FILE *)out,"\tR[0x%06x] <= 0x%08x\n",(ulong)(iVar7 + peVar10->base),
                          (ulong)peVar10->data[uVar12]);
                  uVar12 = uVar12 + 1;
                  iVar4 = iVar4 + 4;
                } while (uVar12 < peVar10->len);
              }
            }
            else {
              fprintf((FILE *)out,"\tR[0x%06x] &= 0x%08x |= 0x%08x\n",(ulong)peVar10->base,
                      (ulong)*peVar10->data,(ulong)peVar10->data[1]);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < bios->hwea_entriesnum);
        }
        envy_bios_dump_hex(bios,out,bios->hwea_offset,bios->hwea_len,mask);
        fputc(10,(FILE *)out);
      }
    }
    envy_bios_print_bit(bios,_stdout,mask);
    envy_bios_print_info(bios,_stdout,mask);
    envy_bios_print_bit_P(bios,_stdout,mask);
    envy_bios_print_bit_M(bios,_stdout,mask);
    envy_bios_print_bit_D(bios,_stdout,mask);
    envy_bios_print_bit_L(bios,_stdout,mask);
    envy_bios_print_bit_T(bios,_stdout,mask);
    envy_bios_print_bit_d(bios,_stdout,mask);
    envy_bios_print_bit_p(bios,_stdout,mask);
    envy_bios_print_dacload(bios,_stdout,mask);
    envy_bios_print_iunk21(bios,_stdout,mask);
    envy_bios_print_i2cscript(bios,_stdout,mask);
    envy_bios_print_dcb(bios,_stdout,mask);
    envy_bios_print_odcb(bios,_stdout,mask);
    envy_bios_print_i2c(bios,_stdout,mask);
    envy_bios_print_gpio(bios,_stdout,mask);
    envy_bios_print_inputdev(bios,_stdout,mask);
    envy_bios_print_cinema(bios,_stdout,mask);
    envy_bios_print_spreadspectrum(bios,_stdout,mask);
    envy_bios_print_extdev(bios,_stdout,mask);
    envy_bios_print_conn(bios,_stdout,mask);
    envy_bios_print_hdtvtt(bios,_stdout,mask);
    envy_bios_print_mux(bios,_stdout,mask);
    envy_bios_print_mem_type(bios,_stdout,mask);
    envy_bios_print_mem_train(bios,_stdout,mask);
    envy_bios_print_mem_train_ptrn(bios,_stdout,mask);
    envy_bios_print_mem_unk0d(bios,_stdout,mask);
    envy_bios_print_power_therm_devices(bios,_stdout,mask);
    envy_bios_print_power_fan_calib(bios,_stdout,mask);
    envy_bios_print_power_unk1c(bios,_stdout,mask);
    envy_bios_print_power_unk24(bios,_stdout,mask);
    envy_bios_print_power_sense(bios,_stdout,mask);
    envy_bios_print_power_budget(bios,_stdout,mask);
    envy_bios_print_power_boost(bios,_stdout,mask);
    envy_bios_print_power_cstep(bios,_stdout,mask);
    envy_bios_print_power_base_clock(bios,_stdout,mask);
    envy_bios_print_power_unk3c(bios,_stdout,mask);
    envy_bios_print_power_unk40(bios,_stdout,mask);
    envy_bios_print_power_unk44(bios,_stdout,mask);
    envy_bios_print_power_unk48(bios,_stdout,mask);
    envy_bios_print_power_unk4c(bios,_stdout,mask);
    envy_bios_print_power_unk50(bios,_stdout,mask);
    envy_bios_print_power_unk54(bios,_stdout,mask);
    envy_bios_print_power_fan(bios,_stdout,mask);
    envy_bios_print_power_fan_mgmt(bios,_stdout,mask);
    envy_bios_print_power_unk60(bios,_stdout,mask);
    envy_bios_print_power_unk64(bios,_stdout,mask);
    envy_bios_print_power_unk68(bios,_stdout,mask);
    envy_bios_print_power_unk6c(bios,_stdout,mask);
    envy_bios_print_power_unk70(bios,_stdout,mask);
    envy_bios_print_power_unk74(bios,_stdout,mask);
    envy_bios_print_power_unk78(bios,_stdout,mask);
    envy_bios_print_power_unk7c(bios,_stdout,mask);
    envy_bios_print_power_unk80(bios,_stdout,mask);
    envy_bios_print_power_unk84(bios,_stdout,mask);
    envy_bios_print_power_unk88(bios,_stdout,mask);
    envy_bios_print_power_unk8c(bios,_stdout,mask);
    envy_bios_print_power_unk90(bios,_stdout,mask);
    envy_bios_print_power_unk94(bios,_stdout,mask);
    envy_bios_print_power_unk98(bios,_stdout,mask);
    envy_bios_print_D_unk2(bios,_stdout,mask);
    envy_bios_print_L_unk0(bios,_stdout,mask);
    envy_bios_print_T_tmds_info(bios,_stdout,mask);
    envy_bios_print_d_dp_info(bios,_stdout,mask);
    envy_bios_print_p_falcon_ucode(bios,_stdout,mask);
  }
  if ((mask >> 0x1d & 1) != 0) {
    qsort(bios->blocks,(long)bios->blocksnum,0x18,block_cmp);
    if (0 < bios->blocksnum) {
      lVar9 = 0;
      lVar11 = 0;
      uVar6 = 0;
      do {
        uVar1 = *(uint *)((long)&bios->blocks->start + lVar9);
        uVar8 = *(int *)((long)&bios->blocks->len + lVar9) + uVar1;
        if (uVar6 <= uVar1 && uVar1 - uVar6 != 0) {
          fprintf((FILE *)out,"0x%08x:0x%08x ???\n",(ulong)uVar6,(ulong)uVar1);
          envy_bios_dump_hex(bios,out,uVar6,uVar1 - uVar6,mask);
        }
        if (uVar1 < uVar6) {
          fwrite("overlap detected!\n",0x12,1,(FILE *)out);
        }
        fprintf((FILE *)out,"0x%08x:0x%08x %s",(ulong)uVar1,(ulong)uVar8,
                *(undefined8 *)((long)&bios->blocks->name + lVar9));
        uVar6 = *(uint *)((long)&bios->blocks->idx + lVar9);
        if (uVar6 != 0xffffffff) {
          iVar4 = strcmp(*(char **)((long)&bios->blocks->name + lVar9),"BIT");
          pcVar5 = "[%d]";
          if (iVar4 == 0) {
            pcVar5 = " \'%c\'";
          }
          fprintf((FILE *)out,pcVar5,(ulong)uVar6);
        }
        fputc(10,(FILE *)out);
        lVar11 = lVar11 + 1;
        lVar9 = lVar9 + 0x18;
        uVar6 = uVar8;
      } while (lVar11 < bios->blocksnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  return;
}

Assistant:

void envy_bios_print (struct envy_bios *bios, FILE *out, unsigned mask) {
	print_pcir(bios, out, mask);
	switch (bios->type) {
	case ENVY_BIOS_TYPE_UNKNOWN:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: UNKNOWN!\n\n");
		break;
	case ENVY_BIOS_TYPE_NV01:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV01\n\n");
		if (mask & ENVY_BIOS_PRINT_SCRIPTS) {
			/* XXX: how to find these properly? */
			fprintf(out, "Pre-mem scripts:\n\n");
			print_nv01_init_script(bios, out, 0x17bc, mask);
			print_nv01_init_script(bios, out, 0x17a2, mask);
			print_nv01_init_script(bios, out, 0x18f4, mask);
			fprintf(out, "1MB script:\n\n");
			print_nv01_init_script(bios, out, 0x199a, mask);
			fprintf(out, "2MB script:\n\n");
			print_nv01_init_script(bios, out, 0x19db, mask);
			fprintf(out, "4MB script:\n\n");
			print_nv01_init_script(bios, out, 0x1a1c, mask);
			fprintf(out, "Post-mem scripts:\n\n");
			print_nv01_init_script(bios, out, 0x198d, mask);
			print_nv01_init_script(bios, out, 0x1929, mask);
			fprintf(out, "Unknown scripts:\n\n");
			print_nv01_init_script(bios, out, 0x184f, mask);
		}
		break;
	case ENVY_BIOS_TYPE_NV03:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV03\n\n");
		if (mask & ENVY_BIOS_PRINT_HWINFO) {
			fprintf(out, "Subsystem id: 0x%04x:0x%04x\n", bios->subsystem_vendor, bios->subsystem_device);
			envy_bios_dump_hex(bios, out, 0x54, 4, mask);
			fprintf(out, "\n");
		}
		print_bmp_nv03(bios, out, mask);
		if (bios->init_script)
			print_nv01_init_script(bios, out, bios->init_script, mask);
		break;
	case ENVY_BIOS_TYPE_NV04:
		if (mask & ENVY_BIOS_PRINT_VERSION)
			fprintf(out, "BIOS type: NV04\n\n");
		if (mask & ENVY_BIOS_PRINT_HWINFO) {
			fprintf(out, "Subsystem id: 0x%04x:0x%04x\n", bios->subsystem_vendor, bios->subsystem_device);
			envy_bios_dump_hex(bios, out, 0x54, 4, mask);
			if (bios->hwinfo_ext_valid) {
				fprintf(out, "Straps 0: select 0x%08x value 0x%08x\n", bios->straps0_select, bios->straps0_value);
				fprintf(out, "Straps 1: select 0x%08x value 0x%08x\n", bios->straps1_select, bios->straps1_value);
				envy_bios_dump_hex(bios, out, 0x58, 0x14, mask);
				int i, j;
				for (i = 0; i < bios->mmioinitsnum; i++) {
					fprintf(out, "Addr 0x%08x len %d\n", bios->mmioinits[i].addr, bios->mmioinits[i].len);
					for (j = 0; j < bios->mmioinits[i].len; j++)
						fprintf(out, "\tR[0x%08x] <= 0x%08x\n", bios->mmioinits[i].addr + j * 4, bios->mmioinits[i].data[j]);
				}
				envy_bios_dump_hex(bios, out, bios->mmioinit_offset, bios->mmioinit_len, mask);
			}
			fprintf(out, "\n");
			if (bios->hwea_offset) {
				fprintf(out, "HWEA at 0x%04x:\n", bios->hwea_offset);
				int i, j;
				for (i = 0; i < bios->hwea_entriesnum; i++) {
					struct envy_bios_hwea_entry *entry = &bios->hwea_entries[i];
					if (bios->hwea_version == 0) {
						for (j = 0; j < entry->len; j++) {
							fprintf(out, "\t");
							switch (entry->type) {
								case 0:
									fprintf(out, "C");
									break;
								case 1:
									fprintf(out, "D");
									break;
								default:
									fprintf(out, "UNK%02X", entry->type);
									break;
							}
							fprintf(out, "[0x%04x] <= 0x%08x\n", entry->base + j * 4, entry->data[j]);
						}
					} else {
						if (entry->type < 2) {
							for (j = 0; j < entry->len; j++) {
								fprintf(out, "\tR[0x%06x] <= 0x%08x\n", entry->base + j * 4 * !entry->type, entry->data[j]);
							}
						} else {
							fprintf(out, "\tR[0x%06x] &= 0x%08x |= 0x%08x\n", entry->base, entry->data[0], entry->data[1]);
						}
					}
				}
				envy_bios_dump_hex(bios, out, bios->hwea_offset, bios->hwea_len, mask);
				fprintf(out, "\n");
			}
		}
		envy_bios_print_bit(bios, stdout, mask);
		envy_bios_print_info(bios, stdout, mask);
		envy_bios_print_bit_P(bios, stdout, mask);
		envy_bios_print_bit_M(bios, stdout, mask);
		envy_bios_print_bit_D(bios, stdout, mask);
		envy_bios_print_bit_L(bios, stdout, mask);
		envy_bios_print_bit_T(bios, stdout, mask);
		envy_bios_print_bit_d(bios, stdout, mask);
		envy_bios_print_bit_p(bios, stdout, mask);

		envy_bios_print_dacload(bios, stdout, mask);
		envy_bios_print_iunk21(bios, stdout, mask);
		envy_bios_print_i2cscript(bios, stdout, mask);

		envy_bios_print_dcb(bios, stdout, mask);
		envy_bios_print_odcb(bios, stdout, mask);
		envy_bios_print_i2c(bios, stdout, mask);
		envy_bios_print_gpio(bios, stdout, mask);
		envy_bios_print_inputdev(bios, stdout, mask);
		envy_bios_print_cinema(bios, stdout, mask);
		envy_bios_print_spreadspectrum(bios, stdout, mask);
		envy_bios_print_extdev(bios, stdout, mask);
		envy_bios_print_conn(bios, stdout, mask);
		envy_bios_print_hdtvtt(bios, stdout, mask);
		envy_bios_print_mux(bios, stdout, mask);

		envy_bios_print_mem_type(bios, stdout, mask);
		envy_bios_print_mem_train(bios, stdout, mask);
		envy_bios_print_mem_train_ptrn(bios, stdout, mask);
		envy_bios_print_mem_unk0d(bios, stdout, mask);

		envy_bios_print_power_therm_devices(bios, stdout, mask);
		envy_bios_print_power_fan_calib(bios, stdout, mask);
		envy_bios_print_power_unk1c(bios, stdout, mask);
		envy_bios_print_power_unk24(bios, stdout, mask);
		envy_bios_print_power_sense(bios, stdout, mask);
		envy_bios_print_power_budget(bios, stdout, mask);
		envy_bios_print_power_boost(bios, stdout, mask);
		envy_bios_print_power_cstep(bios, stdout, mask);
		envy_bios_print_power_base_clock(bios, stdout, mask);
		envy_bios_print_power_unk3c(bios, stdout, mask);
		envy_bios_print_power_unk40(bios, stdout, mask);
		envy_bios_print_power_unk44(bios, stdout, mask);
		envy_bios_print_power_unk48(bios, stdout, mask);
		envy_bios_print_power_unk4c(bios, stdout, mask);
		envy_bios_print_power_unk50(bios, stdout, mask);
		envy_bios_print_power_unk54(bios, stdout, mask);
		envy_bios_print_power_fan(bios, stdout, mask);
		envy_bios_print_power_fan_mgmt(bios, stdout, mask);
		envy_bios_print_power_unk60(bios, stdout, mask);
		envy_bios_print_power_unk64(bios, stdout, mask);
		envy_bios_print_power_unk68(bios, stdout, mask);
		envy_bios_print_power_unk6c(bios, stdout, mask);
		envy_bios_print_power_unk70(bios, stdout, mask);
		envy_bios_print_power_unk74(bios, stdout, mask);
		envy_bios_print_power_unk78(bios, stdout, mask);
		envy_bios_print_power_unk7c(bios, stdout, mask);
		envy_bios_print_power_unk80(bios, stdout, mask);
		envy_bios_print_power_unk84(bios, stdout, mask);
		envy_bios_print_power_unk88(bios, stdout, mask);
		envy_bios_print_power_unk8c(bios, stdout, mask);
		envy_bios_print_power_unk90(bios, stdout, mask);
		envy_bios_print_power_unk94(bios, stdout, mask);
		envy_bios_print_power_unk98(bios, stdout, mask);

		envy_bios_print_D_unk2(bios, stdout, mask);

		envy_bios_print_L_unk0(bios, stdout, mask);

		envy_bios_print_T_tmds_info(bios, stdout, mask);

		envy_bios_print_d_dp_info(bios, stdout, mask);

		envy_bios_print_p_falcon_ucode(bios, stdout, mask);
		break;
	}
	if (mask & ENVY_BIOS_PRINT_BLOCKS) {
		qsort(bios->blocks, bios->blocksnum, sizeof *bios->blocks, block_cmp);
		int i;
		unsigned last = 0;
		for (i = 0; i < bios->blocksnum; i++) {
			unsigned start = bios->blocks[i].start;
			unsigned end = start + bios->blocks[i].len;
			if (start > last) {
				fprintf(out, "0x%08x:0x%08x ???\n", last, start);
				envy_bios_dump_hex(bios, out, last, (start - last), mask);
			}
			if (start < last) {
				fprintf(out, "overlap detected!\n");
			}
			fprintf(out, "0x%08x:0x%08x %s", start, end, bios->blocks[i].name);
			if (bios->blocks[i].idx != -1) {
				if (!strcmp(bios->blocks[i].name, "BIT"))
					fprintf(out, " '%c'", bios->blocks[i].idx);
				else
					fprintf(out, "[%d]", bios->blocks[i].idx);
			}
			fprintf(out, "\n");
			last = end;
		}
		fprintf(out, "\n");
	}
}